

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlRegExecCtxtPtr local_20;
  xmlRegExecCtxtPtr exec;
  int k;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (ctxt != (xmlRelaxNGValidCtxtPtr)0x0) {
    if (ctxt->states != (xmlRelaxNGStatesPtr)0x0) {
      xmlRelaxNGFreeStates((xmlRelaxNGValidCtxtPtr)0x0,ctxt->states);
    }
    if (ctxt->freeState != (xmlRelaxNGStatesPtr)0x0) {
      for (exec._4_4_ = 0; exec._4_4_ < ctxt->freeState->nbState; exec._4_4_ = exec._4_4_ + 1) {
        xmlRelaxNGFreeValidState((xmlRelaxNGValidCtxtPtr)0x0,ctxt->freeState->tabState[exec._4_4_]);
      }
      xmlRelaxNGFreeStates((xmlRelaxNGValidCtxtPtr)0x0,ctxt->freeState);
    }
    if (ctxt->freeStates != (xmlRelaxNGStatesPtr *)0x0) {
      for (exec._4_4_ = 0; exec._4_4_ < ctxt->freeStatesNr; exec._4_4_ = exec._4_4_ + 1) {
        xmlRelaxNGFreeStates((xmlRelaxNGValidCtxtPtr)0x0,ctxt->freeStates[exec._4_4_]);
      }
      (*xmlFree)(ctxt->freeStates);
    }
    if (ctxt->errTab != (xmlRelaxNGValidErrorPtr)0x0) {
      (*xmlFree)(ctxt->errTab);
    }
    if (ctxt->elemTab != (xmlRegExecCtxtPtr *)0x0) {
      local_20 = xmlRelaxNGElemPop(ctxt);
      while (local_20 != (xmlRegExecCtxtPtr)0x0) {
        xmlRegFreeExecCtxt(local_20);
        local_20 = xmlRelaxNGElemPop(ctxt);
      }
      (*xmlFree)(ctxt->elemTab);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

void
xmlRelaxNGFreeValidCtxt(xmlRelaxNGValidCtxtPtr ctxt)
{
    int k;

    if (ctxt == NULL)
        return;
    if (ctxt->states != NULL)
        xmlRelaxNGFreeStates(NULL, ctxt->states);
    if (ctxt->freeState != NULL) {
        for (k = 0; k < ctxt->freeState->nbState; k++) {
            xmlRelaxNGFreeValidState(NULL, ctxt->freeState->tabState[k]);
        }
        xmlRelaxNGFreeStates(NULL, ctxt->freeState);
    }
    if (ctxt->freeStates != NULL) {
        for (k = 0; k < ctxt->freeStatesNr; k++) {
            xmlRelaxNGFreeStates(NULL, ctxt->freeStates[k]);
        }
        xmlFree(ctxt->freeStates);
    }
    if (ctxt->errTab != NULL)
        xmlFree(ctxt->errTab);
    if (ctxt->elemTab != NULL) {
        xmlRegExecCtxtPtr exec;

        exec = xmlRelaxNGElemPop(ctxt);
        while (exec != NULL) {
            xmlRegFreeExecCtxt(exec);
            exec = xmlRelaxNGElemPop(ctxt);
        }
        xmlFree(ctxt->elemTab);
    }
    xmlFree(ctxt);
}